

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  bool bVar1;
  size_t sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  size_t sVar5;
  UnknownField *field;
  
  bVar1 = RepeatedField<google::protobuf::UnknownField>::empty(&this->fields_);
  if (bVar1) {
    sVar2 = 0;
  }
  else {
    sVar2 = RepeatedField<google::protobuf::UnknownField>::SpaceUsedExcludingSelfLong
                      (&this->fields_);
    cVar3 = RepeatedField<google::protobuf::UnknownField>::begin(&this->fields_);
    cVar4 = RepeatedField<google::protobuf::UnknownField>::end(&this->fields_);
    for (; cVar3.it_ != cVar4.it_; cVar3.it_ = cVar3.it_ + 1) {
      if ((cVar3.it_)->type_ == 4) {
        sVar5 = SpaceUsedLong(((cVar3.it_)->data_).group);
        sVar2 = sVar2 + sVar5;
      }
      else if ((cVar3.it_)->type_ == 3) {
        sVar5 = internal::StringSpaceUsedExcludingSelfLong(((cVar3.it_)->data_).string_value);
        sVar2 = sVar2 + sVar5 + 0x20;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = fields_.SpaceUsedExcludingSelfLong();

  for (const UnknownField& field : fields_) {
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}